

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O2

string * __thiscall
BayesianGameWithClusterInfo::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameWithClusterInfo *this,
          BGClusterAlgorithm clusterAlg)

{
  E *this_00;
  undefined4 in_register_00000014;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "Lossless";
    __a = &local_11;
    break;
  case 1:
    __s = "ApproxJB";
    __a = &local_12;
    break;
  case 2:
    __s = "ApproxPjaoh";
    __a = &local_13;
    break;
  case 3:
    __s = "ApproxPjaohJB";
    __a = &local_14;
    break;
  default:
    this_00 = (E *)__cxa_allocate_exception(0x28,this,CONCAT44(in_register_00000014,clusterAlg));
    E::E(this_00,"BayesianGameWithClusterInfo::SoftPrint BGClusterAlgorithm not handled");
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameWithClusterInfo::SoftPrint(BGClusterAlgorithm clusterAlg)
{
    switch(clusterAlg)
    {
    case Lossless:
        return("Lossless");
    case ApproxJB:
        return("ApproxJB");
    case ApproxPjaoh:
        return("ApproxPjaoh");
    case ApproxPjaohJB:
        return("ApproxPjaohJB");
    }

    throw(E("BayesianGameWithClusterInfo::SoftPrint BGClusterAlgorithm not handled"));
    return("");
}